

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

void __thiscall
CStorage::ListDirectory
          (CStorage *this,int Type,char *pPath,FS_LISTDIR_CALLBACK pfnCallback,void *pUser)

{
  long lVar1;
  void *in_RDX;
  int in_ESI;
  FS_LISTDIR_CALLBACK in_RDI;
  CStorage *in_R8;
  long in_FS_OFFSET;
  int i;
  char aBuffer [512];
  char *in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdcc;
  int Type_00;
  int type;
  FS_LISTDIR_CALLBACK cb;
  char *in_stack_fffffffffffffdf8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == -1) {
    type = -1;
    cb = in_RDI;
    for (Type_00 = 0; Type_00 < *(int *)(in_RDI + 0x2010); Type_00 = Type_00 + 1) {
      GetPath(in_R8,Type_00,(char *)in_RDI,in_stack_fffffffffffffdb8,0);
      fs_listdir(in_stack_fffffffffffffdf8,cb,type,in_RDX);
    }
  }
  else if ((-1 < in_ESI) && (in_ESI < *(int *)(in_RDI + 0x2010))) {
    GetPath(in_R8,in_stack_fffffffffffffdcc,(char *)in_RDI,in_stack_fffffffffffffdb8,0);
    fs_listdir(in_stack_fffffffffffffdf8,in_RDI,in_ESI,in_RDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

virtual void ListDirectory(int Type, const char *pPath, FS_LISTDIR_CALLBACK pfnCallback, void *pUser)
	{
		char aBuffer[IO_MAX_PATH_LENGTH];
		if(Type == TYPE_ALL)
		{
			// list all available directories
			for(int i = 0; i < m_NumPaths; ++i)
				fs_listdir(GetPath(i, pPath, aBuffer, sizeof(aBuffer)), pfnCallback, i, pUser);
		}
		else if(Type >= 0 && Type < m_NumPaths)
		{
			// list wanted directory
			fs_listdir(GetPath(Type, pPath, aBuffer, sizeof(aBuffer)), pfnCallback, Type, pUser);
		}
	}